

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

bool __thiscall SemanticAnalyzer::isValid(SemanticAnalyzer *this,shared_ptr<ScriptAstNode> *script)

{
  ostream *out;
  bool bVar1;
  element_type *node;
  shared_ptr<const_Readable> local_e0;
  undefined1 local_d0 [8];
  SemanticAnalyzerRun run;
  shared_ptr<ScriptAstNode> *script_local;
  SemanticAnalyzer *this_local;
  
  out = this->out;
  run.currentScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)script;
  std::shared_ptr<const_Readable>::shared_ptr(&local_e0,&this->reader);
  SemanticAnalyzerRun::SemanticAnalyzerRun((SemanticAnalyzerRun *)local_d0,out,&local_e0);
  std::shared_ptr<const_Readable>::~shared_ptr(&local_e0);
  node = std::__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2> *)
                    run.currentScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  AstWalker::visitScriptAstNode((AstWalker *)local_d0,node);
  bVar1 = SemanticAnalyzerRun::hasErrors((SemanticAnalyzerRun *)local_d0);
  SemanticAnalyzerRun::~SemanticAnalyzerRun((SemanticAnalyzerRun *)local_d0);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool SemanticAnalyzer::isValid(const std::shared_ptr<ScriptAstNode>& script) noexcept {

  SemanticAnalyzerRun run{this->out, this->reader};

  run.visitScriptAstNode(script.get());

  return !run.hasErrors();
}